

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.h
# Opt level: O2

ImportMessageLite * __thiscall
proto2_unittest::TestAllTypesLite::_internal_mutable_optional_import_message(TestAllTypesLite *this)

{
  ImportMessageLite *pIVar1;
  Arena *arena;
  
  pIVar1 = (this->field_0)._impl_.optional_import_message_;
  if (pIVar1 != (ImportMessageLite *)0x0) {
    return pIVar1;
  }
  arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pIVar1 = (ImportMessageLite *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest_import::ImportMessageLite>
                     (arena);
  (this->field_0)._impl_.optional_import_message_ = pIVar1;
  return pIVar1;
}

Assistant:

TestAllTypesLite::_internal_mutable_optional_import_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_import_message_ == nullptr) {
    auto* p = ::google::protobuf::MessageLite::DefaultConstruct<::proto2_unittest_import::ImportMessageLite>(GetArena());
    _impl_.optional_import_message_ = reinterpret_cast<::proto2_unittest_import::ImportMessageLite*>(p);
  }
  return _impl_.optional_import_message_;
}